

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.h
# Opt level: O3

void __thiscall Texture::Texture(Texture *this,char *img)

{
  bool bVar1;
  int iVar2;
  stbi_uc *psVar3;
  float *pfVar4;
  size_t sVar5;
  ostream *poVar6;
  int iVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  bool bVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  int k;
  int iVar15;
  float fVar16;
  HDRLoaderResult result;
  string img_;
  HDRLoaderResult local_78;
  undefined1 local_68 [16];
  char *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  this->type = TEXTURE_RECT;
  Vector3f::Vector3f(&this->color,0.0);
  *(undefined8 *)&(this->scale).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->scale).super__Function_base._M_functor + 8) = 0;
  (this->scale).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->scale)._M_invoker = (_Invoker_type)0x0;
  this->empty = false;
  std::__cxx11::string::string((string *)local_50,img,(allocator *)&local_78);
  std::__cxx11::string::substr((ulong)&local_78,(ulong)local_50);
  iVar2 = std::__cxx11::string::compare((char *)&local_78);
  if ((undefined1 *)CONCAT44(local_78.height,local_78.width) != local_68) {
    operator_delete((undefined1 *)CONCAT44(local_78.height,local_78.width));
  }
  if (iVar2 == 0) {
    this->image_buff_stbi = (uchar *)0x0;
    local_58 = img;
    bVar1 = HDRLoader::load(img,&local_78);
    iVar2 = local_78.height;
    if (!bVar1) {
      __assert_fail("ret",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/fjzzq2002[P]MiniShader/texture.h"
                    ,0x22,"Texture::Texture(const char *)");
    }
    iVar9 = local_78.width / 2;
    uVar12 = 0xffffffffffffffff;
    if (-2 < iVar9 * local_78.height) {
      uVar12 = (long)(((iVar9 * local_78.height) / 2) * 3) << 2;
    }
    pfVar4 = (float *)operator_new__(uVar12);
    this->hdr_buff = pfVar4;
    this->image_w = iVar9;
    iVar2 = iVar2 / 2;
    this->image_h = iVar2;
    this->image_c = 3;
    img = local_58;
    if (1 < local_78.width) {
      iVar15 = 0;
      do {
        if (0 < iVar2) {
          lVar14 = 0;
          do {
            iVar9 = 0;
            do {
              fVar16 = 0.0;
              uVar10 = 0;
              bVar1 = true;
              do {
                bVar8 = bVar1;
                uVar13 = 0;
                bVar1 = true;
                do {
                  bVar11 = bVar1;
                  fVar16 = fVar16 + local_78.cols
                                    [(int)(((uVar13 | (int)lVar14 * 2) +
                                           (uVar10 | iVar15 * 2) * local_78.height) * 3 + iVar9)];
                  uVar13 = 1;
                  bVar1 = false;
                } while (bVar11);
                uVar10 = 1;
                bVar1 = false;
              } while (bVar8);
              fVar16 = powf(fVar16 * 0.25,0.1);
              iVar2 = this->image_h;
              iVar7 = (iVar2 * iVar15 + (int)lVar14) * 3 + iVar9;
              iVar9 = iVar9 + 1;
              this->hdr_buff[iVar7] = fVar16;
            } while (iVar9 != 3);
            lVar14 = lVar14 + 1;
          } while (lVar14 < iVar2);
          iVar9 = this->image_w;
        }
        iVar15 = iVar15 + 1;
        img = local_58;
      } while (iVar15 < iVar9);
    }
  }
  else {
    this->hdr_buff = (float *)0x0;
    psVar3 = stbi_load(img,&this->image_w,&this->image_h,&this->image_c,0);
    this->image_buff_stbi = psVar3;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"loaded image ",0xd);
  if (img == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x2fc4768);
  }
  else {
    sVar5 = strlen(img);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,img,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,": ",2);
  poVar6 = (ostream *)std::ostream::operator<<(&std::cerr,this->image_w);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"x",1);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->image_h);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"x",1);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->image_c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return;
}

Assistant:

Texture(const char* img) :type(TEXTURE_RECT)
	{
		std::string img_ = img;
		if (img_.substr(img_.size() - 4) == ".hdr") {
			image_buff_stbi = nullptr;
			HDRLoaderResult result;
			bool ret = HDRLoader::load(img, result);
			assert(ret);
			hdr_buff = new float[result.width / 2 * result.height / 2 * 3];
			image_w = result.width/2;
			image_h = result.height/2;
			image_c = 3;
			for(int i=0;i<image_w;++i)
				for(int j=0;j<image_h;++j)
					for (int k = 0; k < 3; ++k)
					{
						float s = 0;
						for (int w = 0; w < 2; ++w)
							for (int g = 0; g < 2; ++g)
								s += result.cols[(i * 2 + w) * result.height * 3 + (j * 2 + g) * 3 + k];
						hdr_buff[i * image_h * 3 + j * 3 + k] = powf(s / 4, 0.1);
					}
		}
		else {
			hdr_buff = nullptr;
			image_buff_stbi = stbi_load(img, &image_w, &image_h, &image_c, 0);
		}
		std::cerr << "loaded image " << img << ": " << image_w << "x" << image_h << "x" << image_c << "\n";
	}